

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uregex.cpp
# Opt level: O0

int32_t icu_63::RegexCImpl::appendReplacement
                  (RegularExpression *regexp,UChar *replacementText,int32_t replacementLength,
                  UChar **destBuf,int32_t *destCapacity,UErrorCode *status)

{
  UChar UVar1;
  UBool UVar2;
  UErrorCode UVar3;
  int iVar4;
  UChar32 UVar5;
  int32_t iVar6;
  bool bVar7;
  int32_t local_14c;
  UChar *local_140;
  int32_t local_124;
  UChar *local_118;
  undefined1 local_e0 [6];
  uint16_t __c2_2;
  UnicodeString groupName;
  int32_t digitVal;
  int iStack_90;
  uint16_t __c2_1;
  int32_t numCaptureGroups;
  int32_t numDigits;
  int32_t iStack_84;
  uint16_t __c2;
  UChar32 c32;
  int32_t groupNum;
  UChar32 escapedChar;
  UErrorCode UStack_74;
  UChar c;
  int32_t replIdx;
  UErrorCode possibleOverflowError;
  UErrorCode tempStatus;
  int32_t lastMatchEnd;
  int32_t matchStart;
  int32_t i;
  int32_t destIdx;
  int32_t capacity;
  UChar *dest;
  RegexMatcher *m;
  UErrorCode *pUStack_40;
  UBool pendingBufferOverflow;
  UErrorCode *status_local;
  int32_t *destCapacity_local;
  UChar **destBuf_local;
  UChar *pUStack_20;
  int32_t replacementLength_local;
  UChar *replacementText_local;
  RegularExpression *regexp_local;
  
  m._7_1_ = '\0';
  if (((*status == U_BUFFER_OVERFLOW_ERROR) && (destCapacity != (int32_t *)0x0)) &&
     (*destCapacity == 0)) {
    m._7_1_ = '\x01';
    *status = U_ZERO_ERROR;
  }
  pUStack_40 = status;
  status_local = destCapacity;
  destCapacity_local = (int32_t *)destBuf;
  destBuf_local._4_4_ = replacementLength;
  pUStack_20 = replacementText;
  replacementText_local = (UChar *)regexp;
  UVar2 = validateRE(regexp,'\x01',status);
  if (UVar2 == '\0') {
    regexp_local._4_4_ = 0;
  }
  else if ((((pUStack_20 == (UChar *)0x0) || (destBuf_local._4_4_ < -1)) ||
           ((status_local == (UErrorCode *)0x0 || (destCapacity_local == (int32_t *)0x0)))) ||
          (((*(long *)destCapacity_local == 0 && (U_ZERO_ERROR < *status_local)) ||
           (*status_local < U_ZERO_ERROR)))) {
    *pUStack_40 = U_ILLEGAL_ARGUMENT_ERROR;
    regexp_local._4_4_ = 0;
  }
  else {
    dest = *(UChar **)(replacementText_local + 0x14);
    if ((char)dest[0x41] == '\0') {
      *pUStack_40 = U_REGEX_INVALID_STATE;
      regexp_local._4_4_ = 0;
    }
    else {
      _destIdx = *(UChar **)destCapacity_local;
      i = *status_local;
      matchStart = 0;
      if (destBuf_local._4_4_ == -1) {
        destBuf_local._4_4_ = u_strlen_63(pUStack_20);
      }
      if (*(long *)(replacementText_local + 0x18) == 0) {
        UStack_74 = U_ZERO_ERROR;
        if (_destIdx == (UChar *)0x0) {
          local_118 = (UChar *)0x0;
        }
        else {
          local_118 = _destIdx + matchStart;
        }
        if (i - matchStart < 1) {
          local_124 = 0;
        }
        else {
          local_124 = i - matchStart;
        }
        iVar6 = utext_extract_63(*(UText **)(dest + 0x10),*(int64_t *)(dest + 0x4c),
                                 *(int64_t *)(dest + 0x44),local_118,local_124,
                                 &stack0xffffffffffffff8c);
        matchStart = iVar6 + matchStart;
      }
      else {
        if (*(long *)(*(long *)(*(long *)(dest + 0x10) + 0x38) + 0x48) == 0) {
          possibleOverflowError = (UErrorCode)*(undefined8 *)(dest + 0x4c);
          tempStatus = (UErrorCode)*(undefined8 *)(dest + 0x44);
        }
        else {
          replIdx = 0;
          UVar3 = utext_extract_63(*(UText **)(dest + 0x10),0,*(int64_t *)(dest + 0x4c),(UChar *)0x0
                                   ,0,&replIdx);
          replIdx = 0;
          possibleOverflowError = UVar3;
          iVar6 = utext_extract_63(*(UText **)(dest + 0x10),*(int64_t *)(dest + 0x4c),
                                   *(int64_t *)(dest + 0x44),(UChar *)0x0,0,&replIdx);
          tempStatus = UVar3 + iVar6;
        }
        for (lastMatchEnd = possibleOverflowError; lastMatchEnd < tempStatus;
            lastMatchEnd = lastMatchEnd + 1) {
          appendToBuf(*(UChar *)(*(long *)(replacementText_local + 0x18) + (long)lastMatchEnd * 2),
                      &matchStart,_destIdx,i);
        }
      }
      escapedChar = 0;
      do {
        while( true ) {
          while( true ) {
            bVar7 = false;
            if (escapedChar < destBuf_local._4_4_) {
              UVar2 = ::U_SUCCESS(*pUStack_40);
              bVar7 = UVar2 != '\0';
            }
            if (!bVar7) goto LAB_0016b9b5;
            UVar1 = pUStack_20[escapedChar];
            iVar4 = escapedChar + 1;
            if ((UVar1 == L'$') || (UVar1 == L'\\')) break;
            escapedChar = iVar4;
            appendToBuf(UVar1,&matchStart,_destIdx,i);
          }
          if (UVar1 != L'\\') break;
          escapedChar = iVar4;
          if (destBuf_local._4_4_ <= iVar4) goto LAB_0016b9b5;
          UVar1 = pUStack_20[iVar4];
          if (((UVar1 == L'U') || (UVar1 == L'u')) &&
             (UVar5 = u_unescapeAt_63(uregex_ucstr_unescape_charAt_63,&escapedChar,
                                      destBuf_local._4_4_,pUStack_20), UVar5 != -1)) {
            if (UVar5 < 0x10000) {
              appendToBuf((UChar)UVar5,&matchStart,_destIdx,i);
            }
            else {
              appendToBuf((short)(UVar5 >> 10) + L'ퟀ',&matchStart,_destIdx,i);
              appendToBuf((UChar)UVar5 & 0x3ffU | 0xdc00,&matchStart,_destIdx,i);
            }
          }
          else {
            appendToBuf(UVar1,&matchStart,_destIdx,i);
            escapedChar = escapedChar + 1;
          }
        }
        iStack_84 = 0;
        numDigits = -1;
        if (iVar4 < destBuf_local._4_4_) {
          numDigits = (int32_t)(ushort)pUStack_20[iVar4];
          if ((numDigits & 0xfffff800U) == 0xd800) {
            if ((pUStack_20[iVar4] & 0x400U) == 0) {
              if ((escapedChar + 2 != destBuf_local._4_4_) &&
                 ((pUStack_20[escapedChar + 2] & 0xfc00U) == 0xdc00)) {
                numDigits = numDigits * 0x400 + (uint)(ushort)pUStack_20[escapedChar + 2] +
                            -0x35fdc00;
              }
            }
            else if ((0 < iVar4) && ((pUStack_20[escapedChar] & 0xfc00U) == 0xd800)) {
              numDigits = (uint)(ushort)pUStack_20[escapedChar] * 0x400 + numDigits + -0x35fdc00;
            }
          }
        }
        escapedChar = iVar4;
        UVar2 = u_isdigit_63(numDigits);
        if (UVar2 == '\0') {
          if (numDigits == 0x7b) {
            UnicodeString::UnicodeString((UnicodeString *)local_e0);
            iVar4 = escapedChar + 1;
            if ((((pUStack_20[escapedChar] & 0xfc00U) == 0xd800) && (iVar4 != destBuf_local._4_4_))
               && ((pUStack_20[iVar4] & 0xfc00U) == 0xdc00)) {
              iVar4 = escapedChar + 2;
            }
            while (escapedChar = iVar4, UVar2 = ::U_SUCCESS(*pUStack_40),
                  UVar2 != '\0' && numDigits != 0x7d) {
              if (destBuf_local._4_4_ <= escapedChar) {
                *pUStack_40 = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                break;
              }
              iVar4 = escapedChar + 1;
              numDigits = (int32_t)(ushort)pUStack_20[escapedChar];
              if ((((numDigits & 0xfffffc00U) == 0xd800) && (iVar4 != destBuf_local._4_4_)) &&
                 ((pUStack_20[iVar4] & 0xfc00U) == 0xdc00)) {
                numDigits = numDigits * 0x400 + (uint)(ushort)pUStack_20[iVar4] + -0x35fdc00;
                iVar4 = escapedChar + 2;
              }
              escapedChar = iVar4;
              if (((numDigits < 0x41) || (0x5a < numDigits)) &&
                 (((numDigits < 0x61 || (0x7a < numDigits)) &&
                  ((numDigits < 0x31 || (0x39 < numDigits)))))) {
                if (numDigits == 0x7d) {
                  iStack_84 = uhash_geti_63(*(UHashtable **)
                                             (*(long *)(replacementText_local + 4) + 0xd0),local_e0)
                  ;
                  iVar4 = escapedChar;
                  if (iStack_84 == 0) {
                    *pUStack_40 = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                  }
                }
                else {
                  *pUStack_40 = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                  iVar4 = escapedChar;
                }
              }
              else {
                UnicodeString::append((UnicodeString *)local_e0,numDigits);
                iVar4 = escapedChar;
              }
            }
            UnicodeString::~UnicodeString((UnicodeString *)local_e0);
          }
          else {
            *pUStack_40 = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
          }
        }
        else {
          iStack_90 = 0;
          iVar6 = UVector32::size(*(UVector32 **)(*(long *)(dest + 4) + 0x88));
          while (escapedChar < destBuf_local._4_4_) {
            numDigits = (int32_t)(ushort)pUStack_20[escapedChar];
            if ((numDigits & 0xfffff800U) == 0xd800) {
              if ((pUStack_20[escapedChar] & 0x400U) == 0) {
                if ((escapedChar + 1 != destBuf_local._4_4_) &&
                   ((pUStack_20[escapedChar + 1] & 0xfc00U) == 0xdc00)) {
                  numDigits = numDigits * 0x400 + (uint)(ushort)pUStack_20[escapedChar + 1] +
                              -0x35fdc00;
                }
              }
              else if ((0 < escapedChar) && ((pUStack_20[escapedChar + -1] & 0xfc00U) == 0xd800)) {
                numDigits = (uint)(ushort)pUStack_20[escapedChar + -1] * 0x400 + numDigits +
                            -0x35fdc00;
              }
            }
            UVar2 = u_isdigit_63(numDigits);
            if (UVar2 == '\0') break;
            groupName.fUnion._52_4_ = u_charDigitValue_63(numDigits);
            if (iVar6 < iStack_84 * 10 + groupName.fUnion._52_4_) {
              if (iStack_90 == 0) {
                *pUStack_40 = U_INDEX_OUTOFBOUNDS_ERROR;
              }
              break;
            }
            iStack_84 = iStack_84 * 10 + groupName.fUnion._52_4_;
            iVar4 = escapedChar + 1;
            if ((((pUStack_20[escapedChar] & 0xfc00U) == 0xd800) && (iVar4 != destBuf_local._4_4_))
               && ((pUStack_20[iVar4] & 0xfc00U) == 0xdc00)) {
              iVar4 = escapedChar + 2;
            }
            escapedChar = iVar4;
            iStack_90 = iStack_90 + 1;
          }
        }
        UVar2 = ::U_SUCCESS(*pUStack_40);
        if (UVar2 != '\0') {
          if (_destIdx == (UChar *)0x0) {
            local_140 = (UChar *)0x0;
          }
          else {
            local_140 = _destIdx + matchStart;
          }
          if (i - matchStart < 1) {
            local_14c = 0;
          }
          else {
            local_14c = i - matchStart;
          }
          iVar6 = uregex_group_63((URegularExpression *)replacementText_local,iStack_84,local_140,
                                  local_14c,pUStack_40);
          matchStart = iVar6 + matchStart;
          if (*pUStack_40 == U_BUFFER_OVERFLOW_ERROR) {
            *pUStack_40 = U_ZERO_ERROR;
          }
        }
        UVar2 = ::U_FAILURE(*pUStack_40);
      } while (UVar2 == '\0');
LAB_0016b9b5:
      if (matchStart < i) {
        _destIdx[matchStart] = L'\0';
      }
      else {
        UVar2 = ::U_SUCCESS(*pUStack_40);
        if (UVar2 != '\0') {
          if (matchStart == *status_local) {
            *pUStack_40 = U_STRING_NOT_TERMINATED_WARNING;
          }
          else {
            *pUStack_40 = U_BUFFER_OVERFLOW_ERROR;
          }
        }
      }
      if ((0 < matchStart) && (U_ZERO_ERROR < *status_local)) {
        if (matchStart < i) {
          *(long *)destCapacity_local = *(long *)destCapacity_local + (long)matchStart * 2;
          *status_local = *status_local - matchStart;
        }
        else {
          *(long *)destCapacity_local = *(long *)destCapacity_local + (long)i * 2;
          *status_local = U_ZERO_ERROR;
        }
      }
      if ((m._7_1_ != '\0') && (UVar2 = ::U_SUCCESS(*pUStack_40), UVar2 != '\0')) {
        *pUStack_40 = U_BUFFER_OVERFLOW_ERROR;
      }
      regexp_local._4_4_ = matchStart;
    }
  }
  return regexp_local._4_4_;
}

Assistant:

int32_t RegexCImpl::appendReplacement(RegularExpression    *regexp,
                                      const UChar           *replacementText,
                                      int32_t                replacementLength,
                                      UChar                **destBuf,
                                      int32_t               *destCapacity,
                                      UErrorCode            *status)  {

    // If we come in with a buffer overflow error, don't suppress the operation.
    //  A series of appendReplacements, appendTail need to correctly preflight
    //  the buffer size when an overflow happens somewhere in the middle.
    UBool pendingBufferOverflow = FALSE;
    if (*status == U_BUFFER_OVERFLOW_ERROR && destCapacity != NULL && *destCapacity == 0) {
        pendingBufferOverflow = TRUE;
        *status = U_ZERO_ERROR;
    }

    //
    // Validate all paramters
    //
    if (validateRE(regexp, TRUE, status) == FALSE) {
        return 0;
    }
    if (replacementText == NULL || replacementLength < -1 ||
        destCapacity == NULL || destBuf == NULL ||
        (*destBuf == NULL && *destCapacity > 0) ||
        *destCapacity < 0) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    RegexMatcher *m = regexp->fMatcher;
    if (m->fMatch == FALSE) {
        *status = U_REGEX_INVALID_STATE;
        return 0;
    }

    UChar    *dest             = *destBuf;
    int32_t   capacity         = *destCapacity;
    int32_t   destIdx          =  0;
    int32_t   i;

    // If it wasn't supplied by the caller,  get the length of the replacement text.
    //   TODO:  slightly smarter logic in the copy loop could watch for the NUL on
    //          the fly and avoid this step.
    if (replacementLength == -1) {
        replacementLength = u_strlen(replacementText);
    }

    // Copy input string from the end of previous match to start of current match
    if (regexp->fText != NULL) {
        int32_t matchStart;
        int32_t lastMatchEnd;
        if (UTEXT_USES_U16(m->fInputText)) {
            lastMatchEnd = (int32_t)m->fLastMatchEnd;
            matchStart = (int32_t)m->fMatchStart;
        } else {
            // !!!: Would like a better way to do this!
            UErrorCode tempStatus = U_ZERO_ERROR;
            lastMatchEnd = utext_extract(m->fInputText, 0, m->fLastMatchEnd, NULL, 0, &tempStatus);
            tempStatus = U_ZERO_ERROR;
            matchStart = lastMatchEnd + utext_extract(m->fInputText, m->fLastMatchEnd, m->fMatchStart, NULL, 0, &tempStatus);
        }
        for (i=lastMatchEnd; i<matchStart; i++) {
            appendToBuf(regexp->fText[i], &destIdx, dest, capacity);
        }
    } else {
        UErrorCode possibleOverflowError = U_ZERO_ERROR; // ignore
        destIdx += utext_extract(m->fInputText, m->fLastMatchEnd, m->fMatchStart,
                                 dest==NULL?NULL:&dest[destIdx], REMAINING_CAPACITY(destIdx, capacity),
                                 &possibleOverflowError);
    }
    U_ASSERT(destIdx >= 0);

    // scan the replacement text, looking for substitutions ($n) and \escapes.
    int32_t  replIdx = 0;
    while (replIdx < replacementLength && U_SUCCESS(*status)) {
        UChar  c = replacementText[replIdx];
        replIdx++;
        if (c != DOLLARSIGN && c != BACKSLASH) {
            // Common case, no substitution, no escaping,
            //  just copy the char to the dest buf.
            appendToBuf(c, &destIdx, dest, capacity);
            continue;
        }

        if (c == BACKSLASH) {
            // Backslash Escape.  Copy the following char out without further checks.
            //                    Note:  Surrogate pairs don't need any special handling
            //                           The second half wont be a '$' or a '\', and
            //                           will move to the dest normally on the next
            //                           loop iteration.
            if (replIdx >= replacementLength) {
                break;
            }
            c = replacementText[replIdx];

            if (c==0x55/*U*/ || c==0x75/*u*/) {
                // We have a \udddd or \Udddddddd escape sequence.
                UChar32 escapedChar =
                    u_unescapeAt(uregex_ucstr_unescape_charAt,
                       &replIdx,                   // Index is updated by unescapeAt
                       replacementLength,          // Length of replacement text
                       (void *)replacementText);

                if (escapedChar != (UChar32)0xFFFFFFFF) {
                    if (escapedChar <= 0xffff) {
                        appendToBuf((UChar)escapedChar, &destIdx, dest, capacity);
                    } else {
                        appendToBuf(U16_LEAD(escapedChar), &destIdx, dest, capacity);
                        appendToBuf(U16_TRAIL(escapedChar), &destIdx, dest, capacity);
                    }
                    continue;
                }
                // Note:  if the \u escape was invalid, just fall through and
                //        treat it as a plain \<anything> escape.
            }

            // Plain backslash escape.  Just put out the escaped character.
            appendToBuf(c, &destIdx, dest, capacity);

            replIdx++;
            continue;
        }

        // We've got a $.  Pick up the following capture group name or number.
        // For numbers, consume only digits that produce a valid capture group for the pattern.

        int32_t groupNum  = 0;
        U_ASSERT(c == DOLLARSIGN);
        UChar32 c32 = -1;
        if (replIdx < replacementLength) {
            U16_GET(replacementText, 0, replIdx, replacementLength, c32);
        }
        if (u_isdigit(c32)) {
            int32_t numDigits = 0;
            int32_t numCaptureGroups = m->fPattern->fGroupMap->size();
            for (;;) {
                if (replIdx >= replacementLength) {
                    break;
                }
                U16_GET(replacementText, 0, replIdx, replacementLength, c32);
                if (u_isdigit(c32) == FALSE) {
                    break;
                }

                int32_t digitVal = u_charDigitValue(c32);
                if (groupNum * 10 + digitVal <= numCaptureGroups) {
                    groupNum = groupNum * 10 + digitVal;
                    U16_FWD_1(replacementText, replIdx, replacementLength);
                    numDigits++;
                } else {
                    if (numDigits == 0) {
                        *status = U_INDEX_OUTOFBOUNDS_ERROR;
                    }
                    break;
                }
            }
        } else if (c32 == LEFTBRACKET) {
            // Scan for Named Capture Group, ${name}.
            UnicodeString groupName;
            U16_FWD_1(replacementText, replIdx, replacementLength);
            while (U_SUCCESS(*status) && c32 != RIGHTBRACKET) { 
                if (replIdx >= replacementLength) {
                    *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                    break;
                }
                U16_NEXT(replacementText, replIdx, replacementLength, c32);
                if ((c32 >= 0x41 && c32 <= 0x5a) ||           // A..Z
                        (c32 >= 0x61 && c32 <= 0x7a) ||       // a..z
                        (c32 >= 0x31 && c32 <= 0x39)) {       // 0..9
                    groupName.append(c32);
                } else if (c32 == RIGHTBRACKET) {
                    groupNum = uhash_geti(regexp->fPat->fNamedCaptureMap, &groupName);
                    if (groupNum == 0) {
                        // Name not defined by pattern.
                        *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                    }
                } else {
                    // Character was something other than a name char or a closing '}'
                    *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                }
            }
        } else {
            // $ not followed by {name} or digits.
            *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
        }


        // Finally, append the capture group data to the destination.
        if (U_SUCCESS(*status)) {
            destIdx += uregex_group((URegularExpression*)regexp, groupNum,
                                    dest==NULL?NULL:&dest[destIdx], REMAINING_CAPACITY(destIdx, capacity), status);
            if (*status == U_BUFFER_OVERFLOW_ERROR) {
                // Ignore buffer overflow when extracting the group.  We need to
                //   continue on to get full size of the untruncated result.  We will
                //   raise our own buffer overflow error at the end.
                *status = U_ZERO_ERROR;
            }
        }

        if (U_FAILURE(*status)) {
            // bad group number or name.
            break;
        }
    }

    //
    //  Nul Terminate the dest buffer if possible.
    //  Set the appropriate buffer overflow or not terminated error, if needed.
    //
    if (destIdx < capacity) {
        dest[destIdx] = 0;
    } else if (U_SUCCESS(*status)) {
        if (destIdx == *destCapacity) {
            *status = U_STRING_NOT_TERMINATED_WARNING;
        } else {
            *status = U_BUFFER_OVERFLOW_ERROR;
        }
    }

    //
    // Return an updated dest buffer and capacity to the caller.
    //
    if (destIdx > 0 &&  *destCapacity > 0) {
        if (destIdx < capacity) {
            *destBuf      += destIdx;
            *destCapacity -= destIdx;
        } else {
            *destBuf      += capacity;
            *destCapacity =  0;
        }
    }

    // If we came in with a buffer overflow, make sure we go out with one also.
    //   (A zero length match right at the end of the previous match could
    //    make this function succeed even though a previous call had overflowed the buf)
    if (pendingBufferOverflow && U_SUCCESS(*status)) {
        *status = U_BUFFER_OVERFLOW_ERROR;
    }

    return destIdx;
}